

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O0

clock_id_t __thiscall
tchecker::clock_constraints_visitor_t::clock_id
          (clock_constraints_visitor_t *this,typed_expression_t *e)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  invalid_argument *piVar4;
  uint it;
  range_t<unsigned_int,_unsigned_int> local_28;
  range_t<unsigned_int,_unsigned_int> ids_range;
  typed_lvalue_expression_t *typed_e;
  typed_expression_t *e_local;
  clock_constraints_visitor_t *this_local;
  
  ids_range = (range_t<unsigned_int,_unsigned_int>)
              __dynamic_cast(e,&typed_expression_t::typeinfo,&typed_lvalue_expression_t::typeinfo,0)
  ;
  if (ids_range == (range_t<unsigned_int,_unsigned_int>)0x0) {
    __cxa_bad_cast();
  }
  local_28 = extract_lvalue_variable_ids((typed_lvalue_expression_t *)ids_range);
  bVar2 = range_t<unsigned_int,_unsigned_int>::empty(&local_28);
  if (!bVar2) {
    puVar3 = range_t<unsigned_int,_unsigned_int>::begin(&local_28);
    uVar1 = *puVar3;
    puVar3 = range_t<unsigned_int,_unsigned_int>::end(&local_28);
    if (uVar1 + 1 != *puVar3) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar4,"Cannot determine clock ID");
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    puVar3 = range_t<unsigned_int,_unsigned_int>::begin(&local_28);
    return *puVar3;
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,"Cannot determine clock ID");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

tchecker::clock_id_t clock_id(tchecker::typed_expression_t const & e)
  {
    tchecker::typed_lvalue_expression_t const & typed_e = dynamic_cast<tchecker::typed_lvalue_expression_t const &>(e);
    tchecker::range_t<tchecker::variable_id_t> ids_range = tchecker::extract_lvalue_variable_ids(typed_e);
    if (ids_range.empty())
      throw std::invalid_argument("Cannot determine clock ID");
    auto it = ids_range.begin();
    if (++it != ids_range.end())
      throw std::invalid_argument("Cannot determine clock ID");
    return ids_range.begin();
  }